

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncError UTF8ToLatin1(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  xmlCharEncError local_68;
  int ret;
  uint c;
  uchar *inend;
  uchar *instart;
  uchar *outstart;
  uchar *outend;
  int flush_local;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  void *vctxt_local;
  
  local_68 = XML_ENC_ERR_SPACE;
  if (((out == (uchar *)0x0) || (outlen == (int *)0x0)) || (inlen == (int *)0x0)) {
    vctxt_local._4_4_ = XML_ENC_ERR_INTERNAL;
  }
  else if (in == (uchar *)0x0) {
    *inlen = 0;
    *outlen = 0;
    vctxt_local._4_4_ = XML_ENC_ERR_SUCCESS;
  }
  else {
    iVar2 = *inlen;
    iVar3 = *outlen;
    inlen_local = (int *)in;
    outlen_local = (int *)out;
    while( true ) {
      if (in + iVar2 <= inlen_local) break;
      if (out + iVar3 <= outlen_local) goto LAB_0012d819;
      bVar1 = (byte)*inlen_local;
      if (bVar1 < 0x80) {
        *(byte *)outlen_local = bVar1;
      }
      else {
        if ((bVar1 < 0xc2) || (0xc3 < bVar1)) {
          local_68 = XML_ENC_ERR_INPUT;
          goto LAB_0012d819;
        }
        if ((long)(in + iVar2) - (long)inlen_local < 2) break;
        inlen_local = (int *)((long)inlen_local + 1);
        *(byte *)outlen_local = bVar1 << 6 | *(byte *)inlen_local & 0x3f;
      }
      outlen_local = (int *)((long)outlen_local + 1);
      inlen_local = (int *)((long)inlen_local + 1);
    }
    local_68 = (int)outlen_local - (int)out;
LAB_0012d819:
    *outlen = (int)outlen_local - (int)out;
    *inlen = (int)inlen_local - (int)in;
    vctxt_local._4_4_ = local_68;
  }
  return vctxt_local._4_4_;
}

Assistant:

static xmlCharEncError
UTF8ToLatin1(void *vctxt ATTRIBUTE_UNUSED,
             unsigned char* out, int *outlen,
             const unsigned char* in, int *inlen,
             int flush ATTRIBUTE_UNUSED) {
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned c;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);

    if (in == NULL) {
        *inlen = 0;
        *outlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inend = in + *inlen;
    outend = out + *outlen;
    while (in < inend) {
        if (out >= outend)
            goto done;

	c = *in;

        if (c < 0x80) {
            *out++ = c;
        } else if ((c >= 0xC2) && (c <= 0xC3)) {
            if (inend - in < 2)
                break;
            in++;
            *out++ = (unsigned char) ((c << 6) | (*in & 0x3F));
        } else {
            ret = XML_ENC_ERR_INPUT;
            goto done;
	}

        in++;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}